

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

UINT8 device_start_nes_nsfplay(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData_00;
  void *pvVar1;
  UINT32 local_34;
  UINT32 rate;
  DEV_DATA *devData;
  NESAPU_INF *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_34 = cfg->clock >> 2;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_34 < cfg->smplRate)))) {
    local_34 = cfg->smplRate;
  }
  devData_00.chipInf = calloc(1,0x30);
  if ((DEV_DATA *)devData_00.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    pvVar1 = NES_APU_np_Create(cfg->clock,local_34);
    ((DEV_DATA *)((long)devData_00.chipInf + 8))->chipInf = pvVar1;
    if (((DEV_DATA *)((long)devData_00.chipInf + 8))->chipInf == (void *)0x0) {
      free(devData_00.chipInf);
      cfg_local._7_1_ = 0xff;
    }
    else {
      pvVar1 = NES_DMC_np_Create(cfg->clock,local_34);
      ((DEV_DATA *)((long)devData_00.chipInf + 0x10))->chipInf = pvVar1;
      if (((DEV_DATA *)((long)devData_00.chipInf + 0x10))->chipInf == (void *)0x0) {
        NES_APU_np_Destroy(((DEV_DATA *)((long)devData_00.chipInf + 8))->chipInf);
        free(devData_00.chipInf);
        cfg_local._7_1_ = 0xff;
      }
      else {
        NES_DMC_np_SetAPU(((DEV_DATA *)((long)devData_00.chipInf + 0x10))->chipInf,
                          ((DEV_DATA *)((long)devData_00.chipInf + 8))->chipInf);
        if (cfg->flags == '\0') {
          ((DEV_DATA *)((long)devData_00.chipInf + 0x18))->chipInf = (void *)0x0;
        }
        else {
          pvVar1 = NES_FDS_Create(cfg->clock,local_34);
          ((DEV_DATA *)((long)devData_00.chipInf + 0x18))->chipInf = pvVar1;
        }
        pvVar1 = malloc(0x8000);
        ((DEV_DATA *)((long)devData_00.chipInf + 0x20))->chipInf = pvVar1;
        memset(((DEV_DATA *)((long)devData_00.chipInf + 0x20))->chipInf,0,0x8000);
        NES_DMC_np_SetMemory
                  (((DEV_DATA *)((long)devData_00.chipInf + 0x10))->chipInf,
                   (UINT8 *)((long)((DEV_DATA *)((long)devData_00.chipInf + 0x20))->chipInf +
                            -0x8000));
        *(undefined1 *)&((DEV_DATA *)((long)devData_00.chipInf + 0x28))->chipInf = 0;
        *(void **)devData_00.chipInf = devData_00.chipInf;
        **(undefined8 **)((long)devData_00.chipInf + 8) = devData_00.chipInf;
        **(undefined8 **)((long)devData_00.chipInf + 0x10) = devData_00.chipInf;
        if (*(long *)((long)devData_00.chipInf + 0x18) != 0) {
          **(undefined8 **)((long)devData_00.chipInf + 0x18) = devData_00.chipInf;
        }
        INIT_DEVINF(retDevInf,(DEV_DATA *)devData_00.chipInf,local_34,&devDef_NSFPlay);
        cfg_local._7_1_ = '\0';
      }
    }
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_nes_nsfplay(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	NESAPU_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 4;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (NESAPU_INF*)calloc(1, sizeof(NESAPU_INF));
	if (info == NULL)
		return 0xFF;
	info->chip_apu = NES_APU_np_Create(cfg->clock, rate);
	if (info->chip_apu == NULL)
	{
		free(info);
		return 0xFF;
	}
	info->chip_dmc = NES_DMC_np_Create(cfg->clock, rate);
	if (info->chip_dmc == NULL)
	{
		NES_APU_np_Destroy(info->chip_apu);
		free(info);
		return 0xFF;
	}
	NES_DMC_np_SetAPU(info->chip_dmc, info->chip_apu);
	
#ifdef EC_NES_NSFP_FDS
	if (cfg->flags)	// enable FDS sound
		info->chip_fds = NES_FDS_Create(cfg->clock, rate);
	else
#endif
		info->chip_fds = NULL;
	
	info->memory = (UINT8*)malloc(0x8000);
	memset(info->memory, 0x00, 0x8000);
	NES_DMC_np_SetMemory(info->chip_dmc, info->memory - 0x8000);
	
	info->fds_disable = 0;
	
	// store pointer to NESAPU_INF into sound chip structures
	info->_devData.chipInf = info;
	devData = (DEV_DATA*)info->chip_apu;
	devData->chipInf = info;
	devData = (DEV_DATA*)info->chip_dmc;
	devData->chipInf = info;
	if (info->chip_fds != NULL)
	{
		devData = (DEV_DATA*)info->chip_fds;
		devData->chipInf = info;
	}
	INIT_DEVINF(retDevInf, &info->_devData, rate, &devDef_NSFPlay);
	return 0x00;
}